

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

string * __thiscall
duckdb::CastExceptionText<duckdb::hugeint_t,short>
          (string *__return_storage_ptr__,duckdb *this,hugeint_t input)

{
  int64_t iVar1;
  PhysicalType type;
  hugeint_t input_00;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar1 = input.upper;
  input_00.lower = input.lower;
  TypeIdToString_abi_cxx11_(&local_40,(duckdb *)0xcc,(PhysicalType)input.lower);
  ::std::operator+(&local_c0,"Type ",&local_40);
  ::std::operator+(&local_a0,&local_c0," with value ");
  input_00.upper = iVar1;
  ConvertToString::Operation<duckdb::hugeint_t>(&local_e0,(ConvertToString *)this,input_00);
  ::std::operator+(&local_80,&local_a0,&local_e0);
  ::std::operator+(&local_60,&local_80,
                   " can\'t be cast because the value is out of range for the destination type ");
  TypeIdToString_abi_cxx11_(&local_100,(duckdb *)0x5,type);
  ::std::operator+(__return_storage_ptr__,&local_60,&local_100);
  ::std::__cxx11::string::~string((string *)&local_100);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}